

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_address_hash_dictionary_handler.c
# Opt level: O1

void test_open_address_dictionary_cursor_range(planck_unit_test_t *tc)

{
  ion_err_t iVar1;
  planck_unit_result_t pVar2;
  ion_cursor_status_t iVar3;
  long *__s;
  uint condition;
  int iVar4;
  ion_dict_cursor_t *cursor;
  ion_record_t record;
  ion_record_info_t record_info;
  ion_dictionary_t test_dictionary;
  ion_predicate_t predicate;
  ion_dictionary_handler_t map_handler;
  ion_dict_cursor_t *local_e0;
  ion_record_t local_d8;
  undefined4 local_c8;
  undefined4 local_c4;
  ion_record_info_t local_c0;
  ion_dictionary_t local_b8;
  ion_predicate_t local_a0;
  ion_dictionary_handler_t local_80;
  
  local_c0.key_size = 4;
  local_c0.value_size = 10;
  createTestDictionary(&local_80,&local_c0,10,&local_b8,key_type_numeric_signed);
  local_c4 = 1;
  local_c8 = 5;
  dictionary_build_predicate(&local_a0,'\x01');
  iVar1 = dictionary_find(&local_b8,&local_a0,&local_e0);
  pVar2 = planck_unit_assert_true
                    (tc,(uint)(iVar1 == '\0'),0x1ed,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                     ,"condition was false, expected true");
  if (pVar2 != '\0') {
    pVar2 = planck_unit_assert_true
                      (tc,(uint)(local_e0->status == '\x02'),0x1f0,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                       ,"condition was false, expected true");
    if (pVar2 != '\0') {
      local_d8.value = malloc(10);
      local_d8.key = malloc(4);
      iVar3 = (*local_e0->next)(local_e0,&local_d8);
      condition = 0;
      if (iVar3 == '\x04') {
        iVar4 = 0;
        do {
          pVar2 = planck_unit_assert_true
                            (tc,1,0x1fc,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                             ,"condition was false, expected true");
          if (pVar2 == '\0') goto LAB_00104e06;
          __s = (long *)malloc(10);
          sprintf((char *)__s,"value : %i",
                  (ulong)(uint)(*local_a0.statement.range.lower_bound + iVar4));
          pVar2 = planck_unit_assert_true
                            (tc,(uint)((short)*(long *)((long)local_d8.value + 8) == (short)__s[1]
                                      && *local_d8.value == *__s),0x204,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                             ,"condition was false, expected true");
          if (pVar2 == '\0') goto LAB_00104e06;
          pVar2 = planck_unit_assert_true
                            (tc,(uint)(*(local_e0->predicate->statement).range.lower_bound <=
                                      *local_d8.key),0x205,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                             ,"condition was false, expected true");
          if (pVar2 == '\0') goto LAB_00104e06;
          pVar2 = planck_unit_assert_true
                            (tc,(uint)(*local_d8.key <=
                                      *(local_e0->predicate->statement).range.upper_bound),0x206,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                             ,"condition was false, expected true");
          if (pVar2 == '\0') goto LAB_00104e06;
          iVar4 = iVar4 + 1;
          free(__s);
          iVar3 = (*local_e0->next)(local_e0,&local_d8);
        } while (iVar3 == '\x04');
        condition = (uint)(iVar4 == 5);
      }
      pVar2 = planck_unit_assert_true
                        (tc,condition,0x20b,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                         ,"condition was false, expected true");
      if (pVar2 != '\0') {
        iVar3 = (*local_e0->next)(local_e0,&local_d8);
        pVar2 = planck_unit_assert_true
                          (tc,(uint)(iVar3 == '\x01'),0x20e,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                           ,"condition was false, expected true");
        if (pVar2 != '\0') {
          (*local_e0->destroy)(&local_e0);
          pVar2 = planck_unit_assert_true
                            (tc,(uint)(local_e0 == (ion_dict_cursor_t *)0x0),0x214,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                             ,"condition was false, expected true");
          if (pVar2 != '\0') {
            free(local_d8.key);
            free(local_d8.value);
            dictionary_delete_dictionary(&local_b8);
            return;
          }
        }
      }
    }
  }
LAB_00104e06:
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_open_address_dictionary_cursor_range(
	planck_unit_test_t *tc
) {
	int					size;
	ion_record_info_t	record_info;

	/* this is required for initializing the hash map and should come from the dictionary */
	record_info.key_size	= sizeof(int);
	record_info.value_size	= 10;
	size					= 10;

	ion_dictionary_handler_t	map_handler;			/* create handler for hashmap */
	ion_dictionary_t			test_dictionary;		/* dictionary handler for test instance */

	createTestDictionary(&map_handler, &record_info, size, &test_dictionary, key_type_numeric_signed);

	ion_dict_cursor_t *cursor;	/* create a new cursor */

	/* create a new predicate statement */
	ion_predicate_t predicate;

	dictionary_build_predicate(&predicate, predicate_range, IONIZE(1, int), IONIZE(5, int));
	/* test that the query runs on dictionary instance okay */
	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == dictionary_find(&test_dictionary, &predicate, &cursor));

	/* check the status of the cursor as it should be initialized */
	PLANCK_UNIT_ASSERT_TRUE(tc, cs_cursor_initialized == cursor->status);

	/* user must allocate memory before calling next() */
	ion_record_t record;

	record.value	= malloc(record_info.value_size);
	record.key		= malloc(record_info.key_size);

	int					result_count = 0;
	ion_cursor_status_t cursor_status;

	while (cs_cursor_active == (cursor_status = cursor->next(cursor, &record))) {
		PLANCK_UNIT_ASSERT_TRUE(tc, cs_cursor_active == cursor_status);

		/* check that value is correct that has been returned */
		ion_value_t str;

		str = malloc(record_info.value_size);
		sprintf((char *) str, "value : %i", (*(int *) predicate.statement.range.lower_bound) + result_count);

		PLANCK_UNIT_ASSERT_TRUE(tc, ION_IS_EQUAL == memcmp(record.value, str, record_info.value_size));
		PLANCK_UNIT_ASSERT_TRUE(tc, *(int *) (record.key) >= *(int *) (cursor->predicate->statement.range.lower_bound));
		PLANCK_UNIT_ASSERT_TRUE(tc, *(int *) (record.key) <= *(int *) (cursor->predicate->statement.range.upper_bound));
		result_count++;
		free(str);
	}

	PLANCK_UNIT_ASSERT_TRUE(tc, 5 == result_count);

	/* and as there is only 1 result, the next call should return empty */
	PLANCK_UNIT_ASSERT_TRUE(tc, cs_end_of_results == cursor->next(cursor, &record));

	/* destroy the cursor */
	cursor->destroy(&cursor);

	/* and check that cursor has been destroyed correctly */
	PLANCK_UNIT_ASSERT_TRUE(tc, NULL == cursor);

	free(record.key);
	free(record.value);

	/* and destroy the dictionary instance */
	dictionary_delete_dictionary(&test_dictionary);
}